

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListView::dropEvent(QListView *this,QDropEvent *event)

{
  iterator __first;
  bool bVar1;
  bool bVar2;
  DropAction DVar3;
  DragDropMode DVar4;
  int iVar5;
  uint uVar6;
  QListViewPrivate *pQVar7;
  long *plVar8;
  ulong uVar9;
  QAbstractItemModel *pQVar10;
  QModelIndex *pQVar11;
  socklen_t *__addr_len;
  sockaddr *__addr;
  QDropEvent *in_RSI;
  const_iterator cVar12;
  long *in_RDI;
  long in_FS_OFFSET;
  bool moved;
  QPersistentModelIndex *pIndex;
  add_const_t<QList<QPersistentModelIndex>_> *__range4;
  bool dataMoved;
  int r;
  QModelIndex *index;
  QList<QModelIndex> *__range3;
  bool topIndexDropped;
  bool moveAction;
  QListViewPrivate *d;
  const_iterator __end4;
  const_iterator __begin4;
  QPersistentModelIndex dropRow;
  const_iterator __end3;
  const_iterator __begin3;
  QList<QPersistentModelIndex> persIndexes;
  QList<QModelIndex> selIndexes;
  int row;
  int col;
  QModelIndex topIndex;
  QModelIndex *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  uint sourceRow;
  undefined4 in_stack_fffffffffffffe88;
  uint uVar13;
  uint in_stack_fffffffffffffe8c;
  iterator in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined6 in_stack_fffffffffffffea8;
  undefined1 uVar14;
  undefined1 in_stack_fffffffffffffeaf;
  QAbstractItemView *in_stack_fffffffffffffeb0;
  uint local_13c;
  undefined6 in_stack_fffffffffffffee8;
  byte bVar15;
  byte bVar16;
  socklen_t local_f8 [12];
  QPersistentModelIndex *local_c8;
  const_iterator local_c0;
  const_iterator local_b8;
  undefined1 local_b0 [24];
  undefined1 local_98 [24];
  QPersistentModelIndex local_80;
  QPersistentModelIndex local_78;
  QModelIndex *local_70;
  const_iterator local_68;
  const_iterator local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  QList<QModelIndex> local_40;
  uint local_28;
  uint local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = d_func((QListView *)0x879d1e);
  DVar3 = QDropEvent::dropAction(in_RSI);
  uVar14 = true;
  if (DVar3 != MoveAction) {
    DVar4 = QAbstractItemView::dragDropMode
                      ((QAbstractItemView *)
                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    uVar14 = DVar4 == InternalMove;
  }
  bVar16 = uVar14;
  plVar8 = (long *)QDropEvent::source();
  if ((plVar8 == in_RDI) && ((bVar16 & 1) != 0)) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::QModelIndex((QModelIndex *)0x879dbb);
    bVar15 = 0;
    local_24 = 0xffffffff;
    local_28 = 0xffffffff;
    bVar1 = QEvent::isAccepted((QEvent *)in_RSI);
    if ((!bVar1) &&
       (uVar9 = (**(code **)(*(long *)&(pQVar7->super_QAbstractItemViewPrivate).
                                       super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                       super_QWidgetPrivate + 0x110))
                          (pQVar7,in_RSI,&local_28,&local_24,&local_20), (uVar9 & 1) != 0)) {
      local_40.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_40.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
      local_40.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      (**(code **)(*in_RDI + 0x2d8))(&local_40);
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      QList<QPersistentModelIndex>::QList((QList<QPersistentModelIndex> *)0x879e9f);
      QList<QModelIndex>::size(&local_40);
      QList<QPersistentModelIndex>::reserve
                ((QList<QPersistentModelIndex> *)
                 CONCAT17(in_stack_fffffffffffffeaf,CONCAT16(uVar14,in_stack_fffffffffffffea8)),
                 CONCAT17(bVar16,CONCAT16(bVar15,in_stack_fffffffffffffee8)));
      local_60.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
      local_60 = QList<QModelIndex>::begin
                           ((QList<QModelIndex> *)
                            CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      local_68.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
      local_68 = QList<QModelIndex>::end
                           ((QList<QModelIndex> *)
                            CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      while( true ) {
        local_70 = local_68.i;
        bVar1 = QList<QModelIndex>::const_iterator::operator!=(&local_60,local_68);
        if (!bVar1) break;
        pQVar11 = QList<QModelIndex>::const_iterator::operator*(&local_60);
        QPersistentModelIndex::QPersistentModelIndex(&local_78,(QModelIndex *)pQVar11);
        QList<QPersistentModelIndex>::append
                  ((QList<QPersistentModelIndex> *)
                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   (rvalue_ref)in_stack_fffffffffffffe78);
        QPersistentModelIndex::~QPersistentModelIndex(&local_78);
        bVar1 = ::operator==((QModelIndex *)
                             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                             in_stack_fffffffffffffe78);
        if (bVar1) {
          bVar15 = 1;
          break;
        }
        QList<QModelIndex>::const_iterator::operator++(&local_60);
      }
      if (((bVar15 & 1) == 0) &&
         (bVar1 = QModelIndex::isValid
                            ((QModelIndex *)
                             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)), !bVar1)
         ) {
        QList<QPersistentModelIndex>::begin
                  ((QList<QPersistentModelIndex> *)
                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
        QList<QPersistentModelIndex>::end
                  ((QList<QPersistentModelIndex> *)
                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
        __first.i._4_4_ = in_stack_fffffffffffffe9c;
        __first.i._0_4_ = in_stack_fffffffffffffe98;
        std::sort<QList<QPersistentModelIndex>::iterator>(__first,in_stack_fffffffffffffe90);
        local_80.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
        pQVar10 = QAbstractItemView::model((QAbstractItemView *)in_stack_fffffffffffffe90.i);
        __addr_len = (socklen_t *)(ulong)local_24;
        (**(code **)(*(long *)pQVar10 + 0x60))(local_98,pQVar10,local_28,__addr_len,&local_20);
        QPersistentModelIndex::QPersistentModelIndex(&local_80,(QModelIndex *)local_98);
        if (local_28 == 0xffffffff) {
          in_stack_fffffffffffffe90.i =
               (QPersistentModelIndex *)
               QAbstractItemView::model((QAbstractItemView *)in_stack_fffffffffffffe90.i);
          QModelIndex::QModelIndex((QModelIndex *)0x87a09e);
          local_13c = (**(code **)(*(long *)in_stack_fffffffffffffe90.i + 0x78))
                                (in_stack_fffffffffffffe90.i,local_b0);
        }
        else {
          iVar5 = QPersistentModelIndex::row();
          in_stack_fffffffffffffe8c = local_28;
          local_13c = local_28;
          if (-1 < iVar5) {
            in_stack_fffffffffffffe8c = QPersistentModelIndex::row();
            local_13c = in_stack_fffffffffffffe8c;
          }
        }
        bVar1 = false;
        local_b8.i = (QPersistentModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
        local_b8 = QList<QPersistentModelIndex>::begin
                             ((QList<QPersistentModelIndex> *)
                              CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
        local_c0.i = (QPersistentModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
        local_c0 = QList<QPersistentModelIndex>::end
                             ((QList<QPersistentModelIndex> *)
                              CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
        while( true ) {
          local_c8 = local_c0.i;
          cVar12.i = local_c0.i;
          bVar2 = QList<QPersistentModelIndex>::const_iterator::operator!=(&local_b8,local_c0);
          if (!bVar2) break;
          in_stack_fffffffffffffeb0 =
               (QAbstractItemView *)
               QList<QPersistentModelIndex>::const_iterator::operator*(&local_b8);
          uVar13 = local_13c;
          uVar6 = QPersistentModelIndex::row();
          if (uVar13 == uVar6) {
LAB_0087a256:
            __addr_len = (socklen_t *)(ulong)uVar6;
LAB_0087a25b:
            bVar1 = true;
            iVar5 = QPersistentModelIndex::row();
            local_13c = iVar5 + 1;
          }
          else {
            sourceRow = local_13c;
            iVar5 = QPersistentModelIndex::row();
            uVar6 = iVar5 + 1;
            if (sourceRow == uVar6) goto LAB_0087a256;
            pQVar11 = (QModelIndex *)
                      QAbstractItemView::model((QAbstractItemView *)in_stack_fffffffffffffe90.i);
            QModelIndex::QModelIndex((QModelIndex *)0x87a203);
            QPersistentModelIndex::row();
            QModelIndex::QModelIndex((QModelIndex *)0x87a21e);
            __addr_len = local_f8;
            in_stack_fffffffffffffeaf =
                 QAbstractItemModel::moveRow
                           ((QAbstractItemModel *)in_stack_fffffffffffffe90.i,
                            (QModelIndex *)CONCAT44(in_stack_fffffffffffffe8c,uVar13),sourceRow,
                            pQVar11,0);
            if ((bool)in_stack_fffffffffffffeaf) goto LAB_0087a25b;
          }
          QList<QPersistentModelIndex>::const_iterator::operator++(&local_b8);
        }
        if (bVar1) {
          QEvent::accept((QEvent *)in_RSI,(int)cVar12.i,__addr,__addr_len);
        }
        QPersistentModelIndex::~QPersistentModelIndex(&local_80);
      }
      QList<QPersistentModelIndex>::~QList((QList<QPersistentModelIndex> *)0x87a2ac);
      QList<QModelIndex>::~QList((QList<QModelIndex> *)0x87a2b9);
    }
    bVar1 = QEvent::isAccepted((QEvent *)in_RSI);
    if (bVar1) {
      (pQVar7->super_QAbstractItemViewPrivate).dropEventMoved = true;
    }
  }
  uVar6 = (*pQVar7->commonListView->_vptr_QCommonListViewBase[0x17])(pQVar7->commonListView,in_RSI);
  if (((uVar6 & 1) == 0) || (((pQVar7->super_QAbstractItemViewPrivate).dropEventMoved & 1U) == 0)) {
    if ((((pQVar7->super_QAbstractItemViewPrivate).dropEventMoved & 1U) == 0) && ((bVar16 & 1) != 0)
       ) {
      QEvent::ignore((QEvent *)in_RSI);
    }
    QAbstractItemView::dropEvent
              (in_stack_fffffffffffffeb0,
               (QDropEvent *)
               CONCAT17(in_stack_fffffffffffffeaf,CONCAT16(uVar14,in_stack_fffffffffffffea8)));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListView::dropEvent(QDropEvent *event)
{
    Q_D(QListView);

    const bool moveAction = event->dropAction() == Qt::MoveAction
                         || dragDropMode() == QAbstractItemView::InternalMove;
    if (event->source() == this && moveAction) {
        QModelIndex topIndex;
        bool topIndexDropped = false;
        int col = -1;
        int row = -1;
        // check whether a subclass has already accepted the event, ie. moved the data
        if (!event->isAccepted() && d->dropOn(event, &row, &col, &topIndex)) {
            const QList<QModelIndex> selIndexes = selectedIndexes();
            QList<QPersistentModelIndex> persIndexes;
            persIndexes.reserve(selIndexes.size());

            for (const auto &index : selIndexes) {
                persIndexes.append(index);
                if (index == topIndex) {
                    topIndexDropped = true;
                    break;
                }
            }

            if (!topIndexDropped && !topIndex.isValid()) {
                std::sort(persIndexes.begin(), persIndexes.end()); // The dropped items will remain in the same visual order.

                QPersistentModelIndex dropRow = model()->index(row, col, topIndex);

                int r = row == -1 ? model()->rowCount() : (dropRow.row() >= 0 ? dropRow.row() : row);
                bool dataMoved = false;
                for (const QPersistentModelIndex &pIndex : std::as_const(persIndexes)) {
                    // only generate a move when not same row or behind itself
                    if (r != pIndex.row() && r != pIndex.row() + 1) {
                        // try to move (preserves selection)
                        const bool moved = model()->moveRow(QModelIndex(), pIndex.row(), QModelIndex(), r);
                        if (!moved)
                            continue; // maybe it'll work for other rows
                        dataMoved = true; // success
                    } else {
                        // move onto itself is blocked, don't delete anything
                        dataMoved = true;
                    }
                    r = pIndex.row() + 1;   // Dropped items are inserted contiguously and in the right order.
                }
                if (dataMoved)
                    event->accept();
            }
        }

        // either we or a subclass accepted the move event, so assume that the data was
        // moved and that QAbstractItemView shouldn't remove the source when QDrag::exec returns
        if (event->isAccepted())
            d->dropEventMoved = true;
    }

    if (!d->commonListView->filterDropEvent(event) || !d->dropEventMoved) {
        // icon view didn't move the data, and moveRows not implemented, so fall back to default
        if (!d->dropEventMoved && moveAction)
            event->ignore();
        QAbstractItemView::dropEvent(event);
    }
}